

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture2D_GL.cpp
# Opt level: O2

void __thiscall
Diligent::Texture2D_GL::Texture2D_GL
          (Texture2D_GL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          TextureDesc *TexDesc,bool bIsDeviceInternal)

{
  TextureBaseGL::TextureBaseGL
            (&this->super_TextureBaseGL,pRefCounters,TexViewObjAllocator,pDeviceGL,TexDesc,
             bIsDeviceInternal);
  (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00a58168;
  return;
}

Assistant:

Texture2D_GL::Texture2D_GL(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& TexViewObjAllocator,
                           RenderDeviceGLImpl*        pDeviceGL,
                           const TextureDesc&         TexDesc,
                           bool                       bIsDeviceInternal) :
    // clang-format off
    TextureBaseGL
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        TexDesc,
        bIsDeviceInternal
    }
// clang-format on
{
}